

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob)

{
  int *piVar1;
  undefined4 uVar2;
  size_t sVar3;
  size_t sVar4;
  int i;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  void *pvVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  size_t sVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float in_XMM1_Da;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar57;
  float fVar58;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint uVar60;
  uint uVar64;
  uint uVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  long local_40;
  
  iVar5 = this->operation;
  switch(iVar5) {
  case 0:
    iVar5 = reduction_op<std::plus<float>,std::plus<float>>
                      (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da);
    return iVar5;
  case 1:
    iVar5 = this->dim;
    fVar34 = this->coeff;
    uVar16 = bottom_blob->w;
    uVar18 = (ulong)uVar16;
    uVar17 = bottom_blob->h;
    sVar20 = (size_t)(int)uVar16;
    uVar6 = bottom_blob->c;
    uVar14 = (ulong)uVar6;
    sVar28 = (size_t)(int)uVar6;
    uVar15 = uVar17 * uVar16;
    if (iVar5 == 0) {
      if (((top_blob->dims == 1) && (top_blob->w == 1)) && (top_blob->elemsize == 4))
      goto switchD_00113e24_caseD_0;
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->elemsize = 4;
      top_blob->dims = 1;
      top_blob->w = 1;
      top_blob->h = 1;
      top_blob->c = 1;
      top_blob->cstep = 1;
      pvVar9 = malloc(0x20);
      pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar10 - 8) = pvVar9;
      top_blob->data = pvVar10;
      top_blob->refcount = (int *)((long)pvVar10 + 4);
      *(undefined4 *)((long)pvVar10 + 4) = 1;
      if (uVar6 == 0 || top_blob->c == 0) {
        return -100;
      }
    }
    else {
      switch(iVar5) {
      case 1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar6)) || (top_blob->elemsize != 4)) {
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar6;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar28;
          if (uVar6 != 0) {
            pvVar10 = malloc(sVar28 * 4 + 0x1c);
            pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar9 + -8) = pvVar10;
            top_blob->data = pvVar9;
            piVar1 = (int *)((long)pvVar9 + sVar28 * 4);
            top_blob->refcount = piVar1;
            *piVar1 = 1;
            sVar7 = sVar28;
            goto LAB_00114737;
          }
        }
        break;
      case 2:
        if (((top_blob->dims != 2) || (top_blob->w != uVar17)) ||
           ((top_blob->h != uVar6 || (top_blob->elemsize != 4)))) {
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar17;
          top_blob->h = uVar6;
          top_blob->c = 1;
          uVar60 = uVar6 * uVar17;
          goto LAB_001146c5;
        }
        break;
      case -2:
        if ((((top_blob->dims == 2) && (top_blob->w == uVar16)) && (top_blob->h == uVar17)) &&
           (top_blob->elemsize == 4)) break;
        piVar1 = top_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 4;
        top_blob->dims = 2;
        top_blob->w = uVar16;
        top_blob->h = uVar17;
        top_blob->c = 1;
        uVar60 = uVar15;
LAB_001146c5:
        sVar7 = (size_t)(int)uVar60;
        top_blob->cstep = sVar7;
        if (uVar60 == 0) break;
        pvVar10 = malloc(sVar7 * 4 + 0x1c);
        pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar9 + -8) = pvVar10;
        top_blob->data = pvVar9;
        piVar1 = (int *)((long)pvVar9 + sVar7 * 4);
        top_blob->refcount = piVar1;
        *piVar1 = 1;
        goto LAB_00114737;
      case -1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar16)) || (top_blob->elemsize != 4)) {
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar16;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar20;
          if (uVar16 != 0) {
            pvVar10 = malloc(sVar20 * 4 + 0x1c);
            pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar9 + -8) = pvVar10;
            top_blob->data = pvVar9;
            piVar1 = (int *)((long)pvVar9 + sVar20 * 4);
            top_blob->refcount = piVar1;
            *piVar1 = 1;
            sVar7 = sVar20;
            goto LAB_00114737;
          }
        }
      }
switchD_00113e24_caseD_0:
      pvVar9 = top_blob->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      sVar7 = top_blob->cstep;
LAB_00114737:
      if (sVar7 * (long)top_blob->c == 0) {
        return -100;
      }
      if (iVar5 != 0) {
        switch(iVar5) {
        default:
          goto switchD_0011632e_caseD_0;
        case 1:
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar9 = bottom_blob->data;
          sVar20 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar10 = top_blob->data;
          uVar18 = 0;
          do {
            fVar33 = 0.0;
            if (0 < (int)uVar15) {
              uVar22 = 0;
              do {
                fVar33 = fVar33 + ABS(*(float *)((long)pvVar9 + uVar22 * 4));
                uVar22 = uVar22 + 1;
              } while (uVar15 != uVar22);
            }
            *(float *)((long)pvVar10 + uVar18 * 4) = fVar33 * fVar34;
            uVar18 = uVar18 + 1;
            pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
          } while (uVar18 != uVar14);
          return 0;
        case 2:
          if ((int)uVar6 < 1) {
            return 0;
          }
          pvVar9 = bottom_blob->data;
          sVar28 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pvVar10 = top_blob->data;
          sVar4 = top_blob->elemsize;
          uVar6 = uVar16 - 1;
          uVar18 = 0;
          do {
            if (0 < (int)uVar17) {
              pvVar23 = (void *)(sVar28 * sVar3 * uVar18 + (long)pvVar9);
              uVar22 = 0;
              do {
                if ((int)uVar16 < 1) {
                  fVar33 = 0.0;
                }
                else {
                  fVar33 = *(float *)((long)pvVar23 + uVar22 * 4);
                  iVar5 = 4;
                  fVar48 = 0.0;
                  fVar57 = 0.0;
                  fVar58 = 0.0;
                  fVar59 = 0.0;
                  do {
                    fVar38 = fVar59;
                    fVar37 = fVar58;
                    fVar36 = fVar57;
                    fVar35 = fVar48;
                    fVar48 = fVar35 + ABS(fVar33);
                    fVar57 = fVar36 + ABS(fVar33);
                    fVar58 = fVar37 + ABS(fVar33);
                    fVar59 = fVar38 + ABS(fVar33);
                    iVar25 = iVar5 + -4;
                    iVar26 = iVar5 + (uVar16 + 3 & 0xfffffffc);
                    iVar5 = iVar25;
                  } while (iVar26 != 8);
                  uVar15 = -iVar25;
                  uVar60 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)(uVar15 ^ 0x80000000));
                  uVar64 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 1) ^ 0x80000000));
                  uVar65 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 2) ^ 0x80000000));
                  uVar15 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 3) ^ 0x80000000));
                  auVar39._0_4_ = (uint)fVar35 & uVar60;
                  auVar39._4_4_ = (uint)fVar36 & uVar64;
                  auVar39._8_4_ = (uint)fVar37 & uVar65;
                  auVar39._12_4_ = (uint)fVar38 & uVar15;
                  auVar49._0_4_ = ~uVar60 & (uint)fVar48;
                  auVar49._4_4_ = ~uVar64 & (uint)fVar57;
                  auVar49._8_4_ = ~uVar65 & (uint)fVar58;
                  auVar49._12_4_ = ~uVar15 & (uint)fVar59;
                  auVar49 = auVar49 | auVar39;
                  fVar33 = auVar49._12_4_ + auVar49._4_4_ + auVar49._8_4_ + auVar49._0_4_;
                }
                *(float *)((long)pvVar10 + uVar22 * 4 + sVar7 * sVar4 * uVar18) = fVar33 * fVar34;
                pvVar23 = (void *)((long)pvVar23 + sVar20 * 4);
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar17);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar14);
          return 0;
        case -2:
          uVar16 = (int)sVar7 * top_blob->c;
          if (0 < (int)uVar16) {
            memset(pvVar9,0,(ulong)uVar16 << 2);
          }
          if (0 < (int)uVar6) {
            pvVar9 = bottom_blob->data;
            sVar20 = bottom_blob->elemsize;
            sVar28 = bottom_blob->cstep;
            pvVar10 = top_blob->data;
            uVar18 = 0;
            do {
              if (0 < (int)uVar15) {
                uVar22 = 0;
                do {
                  *(float *)((long)pvVar10 + uVar22 * 4) =
                       ABS(*(float *)((long)pvVar9 + uVar22 * 4)) +
                       *(float *)((long)pvVar10 + uVar22 * 4);
                  uVar22 = uVar22 + 1;
                } while (uVar15 != uVar22);
              }
              uVar18 = uVar18 + 1;
              pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
            } while (uVar18 != uVar14);
          }
          if ((int)uVar15 < 1) {
            return 0;
          }
          pvVar9 = top_blob->data;
          uVar18 = 0;
          do {
            *(float *)((long)pvVar9 + uVar18 * 4) = *(float *)((long)pvVar9 + uVar18 * 4) * fVar34;
            uVar18 = uVar18 + 1;
          } while (uVar15 != uVar18);
          return 0;
        case -1:
          uVar22 = sVar20 + 3 & 0x3ffffffffffffffc;
          local_40 = sVar28 * uVar22;
          if (local_40 == 0) {
            return -100;
          }
          pvVar9 = malloc(local_40 * 4 + 0x1c);
          pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar10 + -8) = pvVar9;
          *(undefined4 *)((long)pvVar10 + local_40 * 4) = 1;
          uVar15 = uVar6 * (int)uVar22;
          if (0 < (int)uVar15) {
            memset(pvVar10,0,(ulong)uVar15 << 2);
          }
          if (0 < (int)uVar6) {
            pvVar9 = bottom_blob->data;
            sVar28 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            uVar11 = 0;
            pvVar23 = pvVar10;
            do {
              if (0 < (int)uVar17) {
                pvVar21 = (void *)(sVar28 * sVar3 * uVar11 + (long)pvVar9);
                uVar12 = 0;
                do {
                  if (0 < (int)uVar16) {
                    uVar19 = 0;
                    do {
                      *(float *)((long)pvVar23 + uVar19 * 4) =
                           ABS(*(float *)((long)pvVar21 + uVar12 * 4)) +
                           *(float *)((long)pvVar23 + uVar19 * 4);
                      uVar19 = uVar19 + 1;
                    } while (uVar18 != uVar19);
                  }
                  pvVar21 = (void *)((long)pvVar21 + sVar20 * 4);
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar17);
              }
              uVar11 = uVar11 + 1;
              pvVar23 = (void *)((long)pvVar23 + uVar22 * 4);
            } while (uVar11 != uVar14);
          }
          uVar17 = (int)sVar7 * top_blob->c;
          if (0 < (int)uVar17) {
            memset(top_blob->data,0,(ulong)uVar17 << 2);
          }
          if (0 < (int)uVar6) {
            pvVar9 = top_blob->data;
            uVar11 = 0;
            pvVar23 = pvVar10;
            do {
              if (0 < (int)uVar16) {
                uVar12 = 0;
                do {
                  *(float *)((long)pvVar9 + uVar12 * 4) =
                       *(float *)((long)pvVar23 + uVar12 * 4) +
                       *(float *)((long)pvVar9 + uVar12 * 4);
                  uVar12 = uVar12 + 1;
                } while (uVar18 != uVar12);
              }
              uVar11 = uVar11 + 1;
              pvVar23 = (void *)((long)pvVar23 + uVar22 * 4);
            } while (uVar11 != uVar14);
          }
          local_40 = local_40 * 4;
          if (0 < (int)uVar16) {
            pvVar9 = top_blob->data;
            uVar14 = 0;
            do {
              *(float *)((long)pvVar9 + uVar14 * 4) = *(float *)((long)pvVar9 + uVar14 * 4) * fVar34
              ;
              uVar14 = uVar14 + 1;
            } while (uVar18 != uVar14);
          }
        }
        goto LAB_001153b7;
      }
      if (uVar6 == 0) {
        return -100;
      }
    }
    pvVar9 = malloc(sVar28 * 4 + 0x1c);
    pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar10 - 8) = pvVar9;
    *(undefined4 *)((long)pvVar10 + sVar28 * 4) = 1;
    if ((int)uVar6 < 1) {
      fVar33 = 0.0;
    }
    else {
      sVar20 = bottom_blob->elemsize;
      sVar7 = bottom_blob->cstep;
      pvVar9 = bottom_blob->data;
      uVar18 = 0;
      do {
        fVar33 = 0.0;
        if (0 < (int)uVar15) {
          uVar22 = 0;
          do {
            fVar33 = fVar33 + ABS(*(float *)((long)pvVar9 + uVar22 * 4));
            uVar22 = uVar22 + 1;
          } while (uVar15 != uVar22);
        }
        *(float *)((long)pvVar10 + uVar18 * 4) = fVar33;
        uVar18 = uVar18 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar7);
      } while (uVar18 != uVar14);
      fVar33 = 0.0;
      uVar18 = 0;
      do {
        fVar33 = fVar33 + *(float *)((long)pvVar10 + uVar18 * 4);
        uVar18 = uVar18 + 1;
      } while (uVar14 != uVar18);
    }
    fVar33 = fVar33 * fVar34;
LAB_001148ec:
    local_40 = sVar28 * 4;
    *(float *)top_blob->data = fVar33;
    LOCK();
    piVar1 = (int *)((long)pvVar10 + local_40);
    iVar5 = *piVar1;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    break;
  case 2:
    iVar5 = this->dim;
    fVar34 = this->coeff;
    uVar16 = bottom_blob->w;
    uVar18 = (ulong)uVar16;
    uVar17 = bottom_blob->h;
    sVar20 = (size_t)(int)uVar16;
    uVar6 = bottom_blob->c;
    uVar14 = (ulong)uVar6;
    sVar28 = (size_t)(int)uVar6;
    uVar15 = uVar17 * uVar16;
    if (iVar5 == 0) {
      if (((top_blob->dims == 1) && (top_blob->w == 1)) && (top_blob->elemsize == 4))
      goto switchD_00113c9d_caseD_0;
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->elemsize = 4;
      top_blob->dims = 1;
      top_blob->w = 1;
      top_blob->h = 1;
      top_blob->c = 1;
      top_blob->cstep = 1;
      pvVar9 = malloc(0x20);
      pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar10 - 8) = pvVar9;
      top_blob->data = pvVar10;
      top_blob->refcount = (int *)((long)pvVar10 + 4);
      *(undefined4 *)((long)pvVar10 + 4) = 1;
      if (uVar6 == 0 || top_blob->c == 0) {
        return -100;
      }
LAB_001144b2:
      pvVar9 = malloc(sVar28 * 4 + 0x1c);
      pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar10 - 8) = pvVar9;
      *(undefined4 *)((long)pvVar10 + sVar28 * 4) = 1;
      if ((int)uVar6 < 1) {
        fVar33 = 0.0;
      }
      else {
        pvVar9 = bottom_blob->data;
        sVar20 = bottom_blob->elemsize;
        sVar7 = bottom_blob->cstep;
        uVar18 = 0;
        do {
          fVar33 = 0.0;
          if (0 < (int)uVar15) {
            uVar22 = 0;
            do {
              fVar48 = *(float *)((long)pvVar9 + uVar22 * 4);
              fVar33 = fVar33 + fVar48 * fVar48;
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          *(float *)((long)pvVar10 + uVar18 * 4) = fVar33;
          uVar18 = uVar18 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar7);
        } while (uVar18 != uVar14);
        fVar33 = 0.0;
        uVar18 = 0;
        do {
          fVar33 = fVar33 + *(float *)((long)pvVar10 + uVar18 * 4);
          uVar18 = uVar18 + 1;
        } while (uVar14 != uVar18);
      }
      fVar33 = fVar33 * fVar34;
      goto LAB_001148ec;
    }
    switch(iVar5) {
    case 1:
      if (((top_blob->dims != 1) || (top_blob->w != uVar6)) || (top_blob->elemsize != 4)) {
        piVar1 = top_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 4;
        top_blob->dims = 1;
        top_blob->w = uVar6;
        top_blob->h = 1;
        top_blob->c = 1;
        top_blob->cstep = sVar28;
        if (uVar6 != 0) {
          pvVar10 = malloc(sVar28 * 4 + 0x1c);
          pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar9 + -8) = pvVar10;
          top_blob->data = pvVar9;
          piVar1 = (int *)((long)pvVar9 + sVar28 * 4);
          top_blob->refcount = piVar1;
          *piVar1 = 1;
          sVar7 = sVar28;
          goto LAB_001143c0;
        }
      }
      break;
    case 2:
      if ((((top_blob->dims != 2) || (top_blob->w != uVar17)) || (top_blob->h != uVar6)) ||
         (top_blob->elemsize != 4)) {
        piVar1 = top_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 4;
        top_blob->dims = 2;
        top_blob->w = uVar17;
        top_blob->h = uVar6;
        top_blob->c = 1;
        uVar60 = uVar6 * uVar17;
        goto LAB_0011434e;
      }
      break;
    case -2:
      if (((top_blob->dims == 2) && (top_blob->w == uVar16)) &&
         ((top_blob->h == uVar17 && (top_blob->elemsize == 4)))) break;
      piVar1 = top_blob->refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = 4;
      top_blob->dims = 2;
      top_blob->w = uVar16;
      top_blob->h = uVar17;
      top_blob->c = 1;
      uVar60 = uVar15;
LAB_0011434e:
      sVar7 = (size_t)(int)uVar60;
      top_blob->cstep = sVar7;
      if (uVar60 == 0) break;
      pvVar10 = malloc(sVar7 * 4 + 0x1c);
      pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar9 + -8) = pvVar10;
      top_blob->data = pvVar9;
      piVar1 = (int *)((long)pvVar9 + sVar7 * 4);
      top_blob->refcount = piVar1;
      *piVar1 = 1;
      goto LAB_001143c0;
    case -1:
      if (((top_blob->dims != 1) || (top_blob->w != uVar16)) || (top_blob->elemsize != 4)) {
        piVar1 = top_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 4;
        top_blob->dims = 1;
        top_blob->w = uVar16;
        top_blob->h = 1;
        top_blob->c = 1;
        top_blob->cstep = sVar20;
        if (uVar16 != 0) {
          pvVar10 = malloc(sVar20 * 4 + 0x1c);
          pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar9 + -8) = pvVar10;
          top_blob->data = pvVar9;
          piVar1 = (int *)((long)pvVar9 + sVar20 * 4);
          top_blob->refcount = piVar1;
          *piVar1 = 1;
          sVar7 = sVar20;
          goto LAB_001143c0;
        }
      }
    }
switchD_00113c9d_caseD_0:
    pvVar9 = top_blob->data;
    if (pvVar9 == (void *)0x0) {
      return -100;
    }
    sVar7 = top_blob->cstep;
LAB_001143c0:
    if (sVar7 * (long)top_blob->c == 0) {
      return -100;
    }
    if (iVar5 == 0) {
      if (uVar6 == 0) {
        return -100;
      }
      goto LAB_001144b2;
    }
    switch(iVar5) {
    default:
      return 0;
    case 1:
      if ((int)uVar6 < 1) {
        return 0;
      }
      sVar20 = bottom_blob->elemsize;
      sVar28 = bottom_blob->cstep;
      pvVar9 = bottom_blob->data;
      pvVar10 = top_blob->data;
      uVar18 = 0;
      do {
        fVar33 = 0.0;
        if (0 < (int)uVar15) {
          uVar22 = 0;
          do {
            fVar48 = *(float *)((long)pvVar9 + uVar22 * 4);
            fVar33 = fVar33 + fVar48 * fVar48;
            uVar22 = uVar22 + 1;
          } while (uVar15 != uVar22);
        }
        *(float *)((long)pvVar10 + uVar18 * 4) = fVar33 * fVar34;
        uVar18 = uVar18 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
      } while (uVar18 != uVar14);
      return 0;
    case 2:
      if ((int)uVar6 < 1) {
        return 0;
      }
      pvVar9 = bottom_blob->data;
      sVar28 = bottom_blob->elemsize;
      sVar3 = bottom_blob->cstep;
      pvVar10 = top_blob->data;
      sVar4 = top_blob->elemsize;
      uVar6 = uVar16 - 1;
      uVar18 = 0;
      do {
        if (0 < (int)uVar17) {
          pvVar23 = (void *)(sVar28 * sVar3 * uVar18 + (long)pvVar9);
          uVar22 = 0;
          do {
            if ((int)uVar16 < 1) {
              fVar33 = 0.0;
            }
            else {
              fVar33 = *(float *)((long)pvVar23 + uVar22 * 4);
              fVar33 = fVar33 * fVar33;
              iVar5 = 4;
              fVar48 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              fVar59 = 0.0;
              do {
                fVar38 = fVar59;
                fVar37 = fVar58;
                fVar36 = fVar57;
                fVar35 = fVar48;
                fVar48 = fVar35 + fVar33;
                fVar57 = fVar36 + fVar33;
                fVar58 = fVar37 + fVar33;
                fVar59 = fVar38 + fVar33;
                iVar25 = iVar5 + -4;
                iVar26 = iVar5 + (uVar16 + 3 & 0xfffffffc);
                iVar5 = iVar25;
              } while (iVar26 != 8);
              uVar15 = -iVar25;
              uVar60 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)(uVar15 ^ 0x80000000));
              uVar64 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 1) ^ 0x80000000));
              uVar65 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 2) ^ 0x80000000));
              uVar15 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 3) ^ 0x80000000));
              fVar33 = (float)(~uVar15 & (uint)fVar59 | (uint)fVar38 & uVar15) +
                       (float)(~uVar64 & (uint)fVar57 | (uint)fVar36 & uVar64) +
                       (float)(~uVar65 & (uint)fVar58 | (uint)fVar37 & uVar65) +
                       (float)(~uVar60 & (uint)fVar48 | (uint)fVar35 & uVar60);
            }
            *(float *)((long)pvVar10 + uVar22 * 4 + sVar7 * sVar4 * uVar18) = fVar33 * fVar34;
            pvVar23 = (void *)((long)pvVar23 + sVar20 * 4);
            uVar22 = uVar22 + 1;
          } while (uVar22 != uVar17);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar14);
      return 0;
    case -2:
      uVar16 = (int)sVar7 * top_blob->c;
      if (0 < (int)uVar16) {
        memset(pvVar9,0,(ulong)uVar16 << 2);
      }
      if (0 < (int)uVar6) {
        sVar20 = bottom_blob->elemsize;
        sVar28 = bottom_blob->cstep;
        pvVar9 = bottom_blob->data;
        pvVar10 = top_blob->data;
        uVar18 = 0;
        do {
          if (0 < (int)uVar15) {
            uVar22 = 0;
            do {
              fVar33 = *(float *)((long)pvVar9 + uVar22 * 4);
              *(float *)((long)pvVar10 + uVar22 * 4) =
                   fVar33 * fVar33 + *(float *)((long)pvVar10 + uVar22 * 4);
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          uVar18 = uVar18 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
        } while (uVar18 != uVar14);
      }
      if ((int)uVar15 < 1) {
        return 0;
      }
      pvVar9 = top_blob->data;
      uVar18 = 0;
      do {
        *(float *)((long)pvVar9 + uVar18 * 4) = *(float *)((long)pvVar9 + uVar18 * 4) * fVar34;
        uVar18 = uVar18 + 1;
      } while (uVar15 != uVar18);
      return 0;
    case -1:
      uVar22 = sVar20 + 3 & 0x3ffffffffffffffc;
      local_40 = sVar28 * uVar22;
      if (local_40 == 0) {
        return -100;
      }
      pvVar9 = malloc(local_40 * 4 + 0x1c);
      pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar10 + -8) = pvVar9;
      *(undefined4 *)((long)pvVar10 + local_40 * 4) = 1;
      uVar15 = uVar6 * (int)uVar22;
      if (0 < (int)uVar15) {
        memset(pvVar10,0,(ulong)uVar15 << 2);
      }
      if (0 < (int)uVar6) {
        sVar28 = bottom_blob->elemsize;
        sVar3 = bottom_blob->cstep;
        pvVar9 = bottom_blob->data;
        uVar11 = 0;
        pvVar23 = pvVar10;
        do {
          if (0 < (int)uVar17) {
            pvVar21 = (void *)(sVar28 * sVar3 * uVar11 + (long)pvVar9);
            uVar12 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar19 = 0;
                do {
                  fVar33 = *(float *)((long)pvVar21 + uVar12 * 4);
                  *(float *)((long)pvVar23 + uVar19 * 4) =
                       fVar33 * fVar33 + *(float *)((long)pvVar23 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar18 != uVar19);
              }
              pvVar21 = (void *)((long)pvVar21 + sVar20 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar17);
          }
          uVar11 = uVar11 + 1;
          pvVar23 = (void *)((long)pvVar23 + uVar22 * 4);
        } while (uVar11 != uVar14);
      }
      uVar17 = (int)sVar7 * top_blob->c;
      if (0 < (int)uVar17) {
        memset(top_blob->data,0,(ulong)uVar17 << 2);
      }
      if (0 < (int)uVar6) {
        pvVar9 = top_blob->data;
        uVar11 = 0;
        pvVar23 = pvVar10;
        do {
          if (0 < (int)uVar16) {
            uVar12 = 0;
            do {
              *(float *)((long)pvVar9 + uVar12 * 4) =
                   *(float *)((long)pvVar23 + uVar12 * 4) + *(float *)((long)pvVar9 + uVar12 * 4);
              uVar12 = uVar12 + 1;
            } while (uVar18 != uVar12);
          }
          uVar11 = uVar11 + 1;
          pvVar23 = (void *)((long)pvVar23 + uVar22 * 4);
        } while (uVar11 != uVar14);
      }
      local_40 = local_40 * 4;
      if (0 < (int)uVar16) {
        pvVar9 = top_blob->data;
        uVar14 = 0;
        do {
          *(float *)((long)pvVar9 + uVar14 * 4) = *(float *)((long)pvVar9 + uVar14 * 4) * fVar34;
          uVar14 = uVar14 + 1;
        } while (uVar18 != uVar14);
      }
    }
LAB_001153b7:
    LOCK();
    piVar1 = (int *)((long)pvVar10 + local_40);
    iVar5 = *piVar1;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    break;
  case 3:
    iVar5 = reduction_op<std::plus<float>,std::plus<float>>
                      (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da);
    if (iVar5 != 0) {
      return -100;
    }
    if (this->dim + 2U < 5) {
      uVar16 = bottom_blob->w;
      uVar17 = bottom_blob->h;
      uVar6 = bottom_blob->c;
      uVar15 = uVar17 * uVar16;
      switch(this->dim) {
      case 0:
        *(float *)top_blob->data = *top_blob->data / (float)(int)(uVar6 * uVar15);
        break;
      case 1:
        if (0 < (int)uVar6) {
          pvVar9 = top_blob->data;
          uVar18 = 0;
          do {
            *(float *)((long)pvVar9 + uVar18 * 4) =
                 *(float *)((long)pvVar9 + uVar18 * 4) * (1.0 / (float)(int)uVar15);
            uVar18 = uVar18 + 1;
          } while (uVar6 != uVar18);
        }
        break;
      case 2:
        if (0 < (int)uVar6) {
          sVar20 = top_blob->cstep;
          sVar28 = top_blob->elemsize;
          pvVar9 = top_blob->data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar17) {
              uVar14 = 0;
              do {
                *(float *)((long)pvVar9 + uVar14 * 4) =
                     *(float *)((long)pvVar9 + uVar14 * 4) * (1.0 / (float)(int)uVar16);
                uVar14 = uVar14 + 1;
              } while (uVar17 != uVar14);
            }
            uVar18 = uVar18 + 1;
            pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
          } while (uVar18 != uVar6);
        }
        break;
      case -2:
        if (0 < (int)uVar15) {
          pvVar9 = top_blob->data;
          uVar18 = 0;
          do {
            *(float *)((long)pvVar9 + uVar18 * 4) =
                 *(float *)((long)pvVar9 + uVar18 * 4) * (1.0 / (float)(int)uVar6);
            uVar18 = uVar18 + 1;
          } while (uVar15 != uVar18);
        }
        break;
      case -1:
        if (0 < (int)uVar16) {
          pvVar9 = top_blob->data;
          uVar18 = 0;
          do {
            *(float *)((long)pvVar9 + uVar18 * 4) =
                 *(float *)((long)pvVar9 + uVar18 * 4) * (1.0 / (float)(int)(uVar17 * uVar6));
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
      }
    }
    iVar5 = this->operation;
  default:
    if (iVar5 == 6) {
      iVar5 = this->dim;
      fVar34 = this->coeff;
      uVar16 = bottom_blob->w;
      uVar18 = (ulong)uVar16;
      uVar17 = bottom_blob->h;
      sVar28 = (size_t)(int)uVar16;
      uVar6 = bottom_blob->c;
      uVar14 = (ulong)uVar6;
      sVar20 = (size_t)(int)uVar6;
      uVar15 = uVar17 * uVar16;
      if (iVar5 == 0) {
        if (((top_blob->dims == 1) && (top_blob->w == 1)) && (top_blob->elemsize == 4))
        goto switchD_00114c2d_caseD_0;
        piVar1 = top_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->elemsize = 4;
        top_blob->dims = 1;
        top_blob->w = 1;
        top_blob->h = 1;
        top_blob->c = 1;
        top_blob->cstep = 1;
        pvVar9 = malloc(0x20);
        pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar10 - 8) = pvVar9;
        top_blob->data = pvVar10;
        top_blob->refcount = (int *)((long)pvVar10 + 4);
        *(undefined4 *)((long)pvVar10 + 4) = 1;
        if (uVar6 == 0 || top_blob->c == 0) {
          return -100;
        }
      }
      else {
        switch(iVar5) {
        case 1:
          if (((top_blob->dims != 1) || (top_blob->w != uVar6)) || (top_blob->elemsize != 4)) {
            piVar1 = top_blob->refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
                free(*(void **)((long)top_blob->data + -8));
              }
            }
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            top_blob->elemsize = 4;
            top_blob->dims = 1;
            top_blob->w = uVar6;
            top_blob->h = 1;
            top_blob->c = 1;
            top_blob->cstep = sVar20;
            if (uVar6 != 0) {
              pvVar10 = malloc(sVar20 * 4 + 0x1c);
              pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)pvVar9 - 8) = pvVar10;
              top_blob->data = pvVar9;
              piVar1 = (int *)((long)pvVar9 + sVar20 * 4);
              top_blob->refcount = piVar1;
              *piVar1 = 1;
              sVar7 = sVar20;
              goto LAB_00115f5b;
            }
          }
          break;
        case 2:
          if (((top_blob->dims != 2) || (top_blob->w != uVar17)) ||
             ((top_blob->h != uVar6 || (top_blob->elemsize != 4)))) {
            piVar1 = top_blob->refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
                free(*(void **)((long)top_blob->data + -8));
              }
            }
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            top_blob->elemsize = 4;
            top_blob->dims = 2;
            top_blob->w = uVar17;
            top_blob->h = uVar6;
            top_blob->c = 1;
            uVar60 = uVar6 * uVar17;
            goto LAB_00115edc;
          }
          break;
        case -2:
          if ((((top_blob->dims == 2) && (top_blob->w == uVar16)) && (top_blob->h == uVar17)) &&
             (top_blob->elemsize == 4)) break;
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar16;
          top_blob->h = uVar17;
          top_blob->c = 1;
          uVar60 = uVar15;
LAB_00115edc:
          sVar7 = (size_t)(int)uVar60;
          top_blob->cstep = sVar7;
          if (uVar60 == 0) break;
          pvVar10 = malloc(sVar7 * 4 + 0x1c);
          pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar9 - 8) = pvVar10;
          top_blob->data = pvVar9;
          piVar1 = (int *)((long)pvVar9 + sVar7 * 4);
          top_blob->refcount = piVar1;
          *piVar1 = 1;
          goto LAB_00115f5b;
        case -1:
          if (((top_blob->dims != 1) || (top_blob->w != uVar16)) || (top_blob->elemsize != 4)) {
            piVar1 = top_blob->refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
                free(*(void **)((long)top_blob->data + -8));
              }
            }
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            top_blob->elemsize = 4;
            top_blob->dims = 1;
            top_blob->w = uVar16;
            top_blob->h = 1;
            top_blob->c = 1;
            top_blob->cstep = sVar28;
            if (uVar16 != 0) {
              pvVar10 = malloc(sVar28 * 4 + 0x1c);
              pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)pvVar9 - 8) = pvVar10;
              top_blob->data = pvVar9;
              piVar1 = (int *)((long)pvVar9 + sVar28 * 4);
              top_blob->refcount = piVar1;
              *piVar1 = 1;
              sVar7 = sVar28;
              goto LAB_00115f5b;
            }
          }
        }
switchD_00114c2d_caseD_0:
        pvVar9 = top_blob->data;
        if (pvVar9 == (void *)0x0) {
          return -100;
        }
        sVar7 = top_blob->cstep;
LAB_00115f5b:
        auVar51 = _DAT_00134480;
        auVar62 = _DAT_00134470;
        auVar55 = _DAT_00134400;
        if (sVar7 * (long)top_blob->c == 0) {
          return -100;
        }
        if (iVar5 != 0) {
          switch(iVar5) {
          default:
            return 0;
          case 1:
            if (0 < (int)uVar6) {
              pvVar9 = bottom_blob->data;
              sVar20 = bottom_blob->elemsize;
              sVar28 = bottom_blob->cstep;
              pvVar10 = top_blob->data;
              uVar18 = 0;
              do {
                fVar33 = 1.0;
                if (0 < (int)uVar15) {
                  uVar22 = 0;
                  fVar33 = 1.0;
                  do {
                    fVar33 = fVar33 * *(float *)((long)pvVar9 + uVar22 * 4);
                    uVar22 = uVar22 + 1;
                  } while (uVar15 != uVar22);
                }
                *(float *)((long)pvVar10 + uVar18 * 4) = fVar33 * fVar34;
                uVar18 = uVar18 + 1;
                pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
              } while (uVar18 != uVar14);
              return 0;
            }
            return 0;
          case 2:
            if (0 < (int)uVar6) {
              pvVar9 = bottom_blob->data;
              sVar20 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              sVar4 = top_blob->elemsize;
              pvVar10 = top_blob->data;
              uVar6 = uVar16 - 1;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  pvVar23 = (void *)(sVar20 * sVar3 * uVar18 + (long)pvVar9);
                  uVar22 = 0;
                  do {
                    fVar33 = 1.0;
                    if (0 < (int)uVar16) {
                      fVar33 = *(float *)((long)pvVar23 + uVar22 * 4);
                      iVar5 = 4;
                      fVar48 = 1.0;
                      fVar57 = 1.0;
                      fVar58 = 1.0;
                      fVar59 = 1.0;
                      do {
                        fVar38 = fVar59;
                        fVar37 = fVar58;
                        fVar36 = fVar57;
                        fVar35 = fVar48;
                        fVar48 = fVar35 * fVar33;
                        fVar57 = fVar36 * fVar33;
                        fVar58 = fVar37 * fVar33;
                        fVar59 = fVar38 * fVar33;
                        iVar26 = iVar5 + -4;
                        iVar25 = (uVar16 + 3 & 0xfffffffc) + iVar5;
                        iVar5 = iVar26;
                      } while (iVar25 != 8);
                      uVar15 = -iVar26;
                      uVar60 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)(uVar15 ^ 0x80000000));
                      uVar64 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 1) ^ 0x80000000))
                      ;
                      uVar65 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 2) ^ 0x80000000))
                      ;
                      uVar15 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 3) ^ 0x80000000))
                      ;
                      auVar55._0_4_ = (uint)fVar35 & uVar60;
                      auVar55._4_4_ = (uint)fVar36 & uVar64;
                      auVar55._8_4_ = (uint)fVar37 & uVar65;
                      auVar55._12_4_ = (uint)fVar38 & uVar15;
                      auVar62._0_4_ = ~uVar60 & (uint)fVar48;
                      auVar62._4_4_ = ~uVar64 & (uint)fVar57;
                      auVar62._8_4_ = ~uVar65 & (uint)fVar58;
                      auVar62._12_4_ = ~uVar15 & (uint)fVar59;
                      auVar62 = auVar62 | auVar55;
                      fVar33 = auVar62._12_4_ * auVar62._4_4_ * auVar62._8_4_ * auVar62._0_4_;
                    }
                    *(float *)((long)pvVar10 + uVar22 * 4 + sVar7 * sVar4 * uVar18) =
                         fVar33 * fVar34;
                    pvVar23 = (void *)((long)pvVar23 + sVar28 * 4);
                    uVar22 = uVar22 + 1;
                  } while (uVar22 != uVar17);
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar14);
              return 0;
            }
            return 0;
          case -2:
            uVar16 = (int)sVar7 * top_blob->c;
            if (0 < (int)uVar16) {
              lVar8 = (ulong)uVar16 - 1;
              auVar50._8_4_ = (int)lVar8;
              auVar50._0_8_ = lVar8;
              auVar50._12_4_ = (int)((ulong)lVar8 >> 0x20);
              uVar18 = 0;
              auVar50 = auVar50 ^ _DAT_00134400;
              do {
                auVar41._8_4_ = (int)uVar18;
                auVar41._0_8_ = uVar18;
                auVar41._12_4_ = (int)(uVar18 >> 0x20);
                auVar53 = (auVar41 | auVar51) ^ auVar55;
                iVar5 = auVar50._4_4_;
                if ((bool)(~(auVar53._4_4_ == iVar5 && auVar50._0_4_ < auVar53._0_4_ ||
                            iVar5 < auVar53._4_4_) & 1)) {
                  *(undefined4 *)((long)pvVar9 + uVar18 * 4) = 0x3f800000;
                }
                if ((auVar53._12_4_ != auVar50._12_4_ || auVar53._8_4_ <= auVar50._8_4_) &&
                    auVar53._12_4_ <= auVar50._12_4_) {
                  *(undefined4 *)((long)pvVar9 + uVar18 * 4 + 4) = 0x3f800000;
                }
                auVar53 = (auVar41 | auVar62) ^ auVar55;
                iVar25 = auVar53._4_4_;
                if (iVar25 <= iVar5 && (iVar25 != iVar5 || auVar53._0_4_ <= auVar50._0_4_)) {
                  *(undefined4 *)((long)pvVar9 + uVar18 * 4 + 8) = 0x3f800000;
                  *(undefined4 *)((long)pvVar9 + uVar18 * 4 + 0xc) = 0x3f800000;
                }
                uVar18 = uVar18 + 4;
              } while ((uVar16 + 3 & 0xfffffffc) != uVar18);
            }
            if (0 < (int)uVar6) {
              sVar20 = bottom_blob->elemsize;
              sVar28 = bottom_blob->cstep;
              pvVar9 = bottom_blob->data;
              pvVar10 = top_blob->data;
              uVar18 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar22 = 0;
                  do {
                    *(float *)((long)pvVar10 + uVar22 * 4) =
                         *(float *)((long)pvVar9 + uVar22 * 4) *
                         *(float *)((long)pvVar10 + uVar22 * 4);
                    uVar22 = uVar22 + 1;
                  } while (uVar15 != uVar22);
                }
                uVar18 = uVar18 + 1;
                pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
              } while (uVar18 != uVar14);
            }
            if (0 < (int)uVar15) {
              pvVar9 = top_blob->data;
              uVar18 = 0;
              do {
                *(float *)((long)pvVar9 + uVar18 * 4) =
                     *(float *)((long)pvVar9 + uVar18 * 4) * fVar34;
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
              return 0;
            }
            return 0;
          case -1:
            uVar22 = sVar28 + 3 & 0x3ffffffffffffffc;
            lVar8 = sVar20 * uVar22;
            if (lVar8 == 0) {
              return -100;
            }
            pvVar9 = malloc(lVar8 * 4 + 0x1c);
            uVar11 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
            *(void **)(uVar11 - 8) = pvVar9;
            *(undefined4 *)(uVar11 + lVar8 * 4) = 1;
            auVar55 = _DAT_00134700;
            uVar15 = uVar6 * (int)uVar22;
            if (0 < (int)uVar15) {
              uVar12 = 0;
              do {
                *(undefined1 (*) [16])(uVar11 + uVar12 * 4) = auVar55;
                uVar12 = uVar12 + 4;
              } while (uVar15 != uVar12);
            }
            if (0 < (int)uVar6) {
              sVar20 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar9 = bottom_blob->data;
              uVar19 = 0;
              uVar12 = uVar11;
              do {
                if (0 < (int)uVar17) {
                  pvVar10 = (void *)(sVar20 * sVar3 * uVar19 + (long)pvVar9);
                  uVar24 = 0;
                  do {
                    if (0 < (int)uVar16) {
                      uVar27 = 0;
                      do {
                        *(float *)(uVar12 + uVar27 * 4) =
                             *(float *)((long)pvVar10 + uVar24 * 4) *
                             *(float *)(uVar12 + uVar27 * 4);
                        uVar27 = uVar27 + 1;
                      } while (uVar18 != uVar27);
                    }
                    pvVar10 = (void *)((long)pvVar10 + sVar28 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != uVar17);
                }
                uVar19 = uVar19 + 1;
                uVar12 = uVar12 + uVar22 * 4;
              } while (uVar19 != uVar14);
            }
            auVar51 = _DAT_00134480;
            auVar62 = _DAT_00134470;
            auVar55 = _DAT_00134400;
            uVar17 = (int)sVar7 * top_blob->c;
            if (0 < (int)uVar17) {
              pvVar9 = top_blob->data;
              lVar13 = (ulong)uVar17 - 1;
              auVar53._8_4_ = (int)lVar13;
              auVar53._0_8_ = lVar13;
              auVar53._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar12 = 0;
              auVar53 = auVar53 ^ _DAT_00134400;
              do {
                auVar44._8_4_ = (int)uVar12;
                auVar44._0_8_ = uVar12;
                auVar44._12_4_ = (int)(uVar12 >> 0x20);
                auVar50 = (auVar44 | auVar51) ^ auVar55;
                iVar5 = auVar53._4_4_;
                if ((bool)(~(auVar50._4_4_ == iVar5 && auVar53._0_4_ < auVar50._0_4_ ||
                            iVar5 < auVar50._4_4_) & 1)) {
                  *(undefined4 *)((long)pvVar9 + uVar12 * 4) = 0x3f800000;
                }
                if ((auVar50._12_4_ != auVar53._12_4_ || auVar50._8_4_ <= auVar53._8_4_) &&
                    auVar50._12_4_ <= auVar53._12_4_) {
                  *(undefined4 *)((long)pvVar9 + uVar12 * 4 + 4) = 0x3f800000;
                }
                auVar44 = (auVar44 | auVar62) ^ auVar55;
                iVar25 = auVar44._4_4_;
                if (iVar25 <= iVar5 && (iVar25 != iVar5 || auVar44._0_4_ <= auVar53._0_4_)) {
                  *(undefined4 *)((long)pvVar9 + uVar12 * 4 + 8) = 0x3f800000;
                  *(undefined4 *)((long)pvVar9 + uVar12 * 4 + 0xc) = 0x3f800000;
                }
                uVar12 = uVar12 + 4;
              } while ((uVar17 + 3 & 0xfffffffc) != uVar12);
            }
            if (0 < (int)uVar6) {
              pvVar9 = top_blob->data;
              uVar19 = 0;
              uVar12 = uVar11;
              do {
                if (0 < (int)uVar16) {
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar9 + uVar24 * 4) =
                         *(float *)(uVar12 + uVar24 * 4) * *(float *)((long)pvVar9 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar18 != uVar24);
                }
                uVar19 = uVar19 + 1;
                uVar12 = uVar12 + uVar22 * 4;
              } while (uVar19 != uVar14);
            }
            lVar8 = lVar8 * 4;
            if (0 < (int)uVar16) {
              pvVar9 = top_blob->data;
              uVar14 = 0;
              do {
                *(float *)((long)pvVar9 + uVar14 * 4) =
                     *(float *)((long)pvVar9 + uVar14 * 4) * fVar34;
                uVar14 = uVar14 + 1;
              } while (uVar18 != uVar14);
            }
          }
          goto LAB_00116f3d;
        }
        if (uVar6 == 0) {
          return -100;
        }
      }
      lVar8 = sVar20 << 2;
      pvVar9 = malloc(sVar20 * 4 + 0x1c);
      uVar11 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar11 - 8) = pvVar9;
      *(undefined4 *)(uVar11 + sVar20 * 4) = 1;
      if ((int)uVar6 < 1) {
        fVar33 = 1.0;
      }
      else {
        sVar20 = bottom_blob->elemsize;
        sVar28 = bottom_blob->cstep;
        pvVar9 = bottom_blob->data;
        uVar18 = 0;
        do {
          fVar33 = 1.0;
          if (0 < (int)uVar15) {
            uVar22 = 0;
            fVar33 = 1.0;
            do {
              fVar33 = fVar33 * *(float *)((long)pvVar9 + uVar22 * 4);
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          *(float *)(uVar11 + uVar18 * 4) = fVar33;
          uVar18 = uVar18 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
        } while (uVar18 != uVar14);
        fVar33 = 1.0;
        uVar18 = 0;
        do {
          fVar33 = fVar33 * *(float *)(uVar11 + uVar18 * 4);
          uVar18 = uVar18 + 1;
        } while (uVar14 != uVar18);
      }
LAB_0011658f:
      *(float *)top_blob->data = fVar33 * fVar34;
      LOCK();
      piVar1 = (int *)(uVar11 + lVar8);
      iVar5 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      if (iVar5 != 5) {
        if (iVar5 != 4) {
          return 0;
        }
        iVar5 = this->dim;
        fVar34 = this->coeff;
        uVar16 = bottom_blob->w;
        uVar18 = (ulong)uVar16;
        uVar17 = bottom_blob->h;
        sVar28 = (size_t)(int)uVar16;
        uVar6 = bottom_blob->c;
        uVar14 = (ulong)uVar6;
        sVar20 = (size_t)(int)uVar6;
        uVar15 = uVar17 * uVar16;
        if (iVar5 == 0) {
          if (((top_blob->dims == 1) && (top_blob->w == 1)) && (top_blob->elemsize == 4))
          goto switchD_00114a5f_caseD_0;
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = 1;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = 1;
          pvVar9 = malloc(0x20);
          pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar10 - 8) = pvVar9;
          top_blob->data = pvVar10;
          top_blob->refcount = (int *)((long)pvVar10 + 4);
          *(undefined4 *)((long)pvVar10 + 4) = 1;
          if (uVar6 == 0 || top_blob->c == 0) {
            return -100;
          }
        }
        else {
          switch(iVar5) {
          case 1:
            if (((top_blob->dims != 1) || (top_blob->w != uVar6)) || (top_blob->elemsize != 4)) {
              piVar1 = top_blob->refcount;
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
                  free(*(void **)((long)top_blob->data + -8));
                }
              }
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              top_blob->elemsize = 4;
              top_blob->dims = 1;
              top_blob->w = uVar6;
              top_blob->h = 1;
              top_blob->c = 1;
              top_blob->cstep = sVar20;
              if (uVar6 != 0) {
                pvVar10 = malloc(sVar20 * 4 + 0x1c);
                pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
                *(void **)((long)pvVar9 - 8) = pvVar10;
                top_blob->data = pvVar9;
                piVar1 = (int *)((long)pvVar9 + sVar20 * 4);
                top_blob->refcount = piVar1;
                *piVar1 = 1;
                sVar7 = sVar20;
                goto LAB_001162eb;
              }
            }
            break;
          case 2:
            if (((top_blob->dims != 2) || (top_blob->w != uVar17)) ||
               ((top_blob->h != uVar6 || (top_blob->elemsize != 4)))) {
              piVar1 = top_blob->refcount;
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
                  free(*(void **)((long)top_blob->data + -8));
                }
              }
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              top_blob->elemsize = 4;
              top_blob->dims = 2;
              top_blob->w = uVar17;
              top_blob->h = uVar6;
              top_blob->c = 1;
              uVar60 = uVar6 * uVar17;
              goto LAB_0011626c;
            }
            break;
          case -2:
            if ((((top_blob->dims == 2) && (top_blob->w == uVar16)) && (top_blob->h == uVar17)) &&
               (top_blob->elemsize == 4)) break;
            piVar1 = top_blob->refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
                free(*(void **)((long)top_blob->data + -8));
              }
            }
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            top_blob->elemsize = 4;
            top_blob->dims = 2;
            top_blob->w = uVar16;
            top_blob->h = uVar17;
            top_blob->c = 1;
            uVar60 = uVar15;
LAB_0011626c:
            sVar7 = (size_t)(int)uVar60;
            top_blob->cstep = sVar7;
            if (uVar60 == 0) break;
            pvVar10 = malloc(sVar7 * 4 + 0x1c);
            pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar9 - 8) = pvVar10;
            top_blob->data = pvVar9;
            piVar1 = (int *)((long)pvVar9 + sVar7 * 4);
            top_blob->refcount = piVar1;
            *piVar1 = 1;
            goto LAB_001162eb;
          case -1:
            if (((top_blob->dims != 1) || (top_blob->w != uVar16)) || (top_blob->elemsize != 4)) {
              piVar1 = top_blob->refcount;
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
                  free(*(void **)((long)top_blob->data + -8));
                }
              }
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              top_blob->elemsize = 4;
              top_blob->dims = 1;
              top_blob->w = uVar16;
              top_blob->h = 1;
              top_blob->c = 1;
              top_blob->cstep = sVar28;
              if (uVar16 != 0) {
                pvVar10 = malloc(sVar28 * 4 + 0x1c);
                pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
                *(void **)((long)pvVar9 - 8) = pvVar10;
                top_blob->data = pvVar9;
                piVar1 = (int *)((long)pvVar9 + sVar28 * 4);
                top_blob->refcount = piVar1;
                *piVar1 = 1;
                sVar7 = sVar28;
                goto LAB_001162eb;
              }
            }
          }
switchD_00114a5f_caseD_0:
          pvVar9 = top_blob->data;
          if (pvVar9 == (void *)0x0) {
            return -100;
          }
          sVar7 = top_blob->cstep;
LAB_001162eb:
          auVar53 = _DAT_00134720;
          auVar51 = _DAT_00134480;
          auVar62 = _DAT_00134470;
          auVar55 = _DAT_00134400;
          if (sVar7 * (long)top_blob->c == 0) {
            return -100;
          }
          if (iVar5 != 0) {
            switch(iVar5) {
            default:
              return 0;
            case 1:
              if ((int)uVar6 < 1) {
                return 0;
              }
              pvVar9 = bottom_blob->data;
              sVar20 = bottom_blob->elemsize;
              sVar28 = bottom_blob->cstep;
              pvVar10 = top_blob->data;
              uVar18 = 0;
              do {
                fVar33 = -3.4028235e+38;
                if (0 < (int)uVar15) {
                  uVar22 = 0;
                  fVar33 = -3.4028235e+38;
                  do {
                    fVar48 = *(float *)((long)pvVar9 + uVar22 * 4);
                    if (fVar33 <= fVar48) {
                      fVar33 = fVar48;
                    }
                    uVar22 = uVar22 + 1;
                  } while (uVar15 != uVar22);
                }
                *(float *)((long)pvVar10 + uVar18 * 4) = fVar33 * fVar34;
                uVar18 = uVar18 + 1;
                pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
              } while (uVar18 != uVar14);
              return 0;
            case 2:
              if ((int)uVar6 < 1) {
                return 0;
              }
              pvVar9 = bottom_blob->data;
              sVar20 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              sVar4 = top_blob->elemsize;
              pvVar10 = top_blob->data;
              uVar6 = uVar16 - 1;
              uVar18 = 0;
              do {
                if (0 < (int)uVar17) {
                  pvVar23 = (void *)(sVar20 * sVar3 * uVar18 + (long)pvVar9);
                  uVar22 = 0;
                  do {
                    fVar33 = -3.4028235e+38;
                    if (0 < (int)uVar16) {
                      uVar2 = *(undefined4 *)((long)pvVar23 + uVar22 * 4);
                      auVar54._4_4_ = uVar2;
                      auVar54._0_4_ = uVar2;
                      auVar55 = auVar53;
                      iVar5 = 4;
                      do {
                        auVar62 = auVar55;
                        auVar54._8_4_ = uVar2;
                        auVar54._12_4_ = uVar2;
                        auVar55 = maxps(auVar54,auVar62);
                        iVar26 = iVar5 + -4;
                        iVar25 = (uVar16 + 3 & 0xfffffffc) + iVar5;
                        iVar5 = iVar26;
                      } while (iVar25 != 8);
                      uVar15 = -iVar26;
                      uVar60 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)(uVar15 ^ 0x80000000));
                      uVar64 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 1) ^ 0x80000000))
                      ;
                      uVar65 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 2) ^ 0x80000000))
                      ;
                      uVar15 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 3) ^ 0x80000000))
                      ;
                      auVar47._0_4_ = auVar62._0_4_ & uVar60;
                      auVar47._4_4_ = auVar62._4_4_ & uVar64;
                      auVar47._8_4_ = auVar62._8_4_ & uVar65;
                      auVar47._12_4_ = auVar62._12_4_ & uVar15;
                      auVar63._0_4_ = ~uVar60 & auVar55._0_4_;
                      auVar63._4_4_ = ~uVar64 & auVar55._4_4_;
                      auVar63._8_4_ = ~uVar65 & auVar55._8_4_;
                      auVar63._12_4_ = ~uVar15 & auVar55._12_4_;
                      auVar63 = auVar63 | auVar47;
                      auVar56._0_8_ = auVar63._8_8_;
                      auVar56._8_4_ = auVar63._8_4_;
                      auVar56._12_4_ = auVar63._12_4_;
                      auVar55 = maxps(auVar56,auVar63);
                      fVar33 = auVar55._4_4_;
                      if (auVar55._4_4_ <= auVar55._0_4_) {
                        fVar33 = auVar55._0_4_;
                      }
                    }
                    *(float *)((long)pvVar10 + uVar22 * 4 + sVar7 * sVar4 * uVar18) =
                         fVar33 * fVar34;
                    pvVar23 = (void *)((long)pvVar23 + sVar28 * 4);
                    uVar22 = uVar22 + 1;
                  } while (uVar22 != uVar17);
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar14);
              return 0;
            case -2:
              uVar16 = (int)sVar7 * top_blob->c;
              if (0 < (int)uVar16) {
                lVar8 = (ulong)uVar16 - 1;
                auVar30._8_4_ = (int)lVar8;
                auVar30._0_8_ = lVar8;
                auVar30._12_4_ = (int)((ulong)lVar8 >> 0x20);
                uVar18 = 0;
                auVar30 = auVar30 ^ _DAT_00134400;
                do {
                  auVar42._8_4_ = (int)uVar18;
                  auVar42._0_8_ = uVar18;
                  auVar42._12_4_ = (int)(uVar18 >> 0x20);
                  auVar53 = (auVar42 | auVar51) ^ auVar55;
                  iVar5 = auVar30._4_4_;
                  if ((bool)(~(auVar53._4_4_ == iVar5 && auVar30._0_4_ < auVar53._0_4_ ||
                              iVar5 < auVar53._4_4_) & 1)) {
                    *(undefined4 *)((long)pvVar9 + uVar18 * 4) = 0xff7fffff;
                  }
                  if ((auVar53._12_4_ != auVar30._12_4_ || auVar53._8_4_ <= auVar30._8_4_) &&
                      auVar53._12_4_ <= auVar30._12_4_) {
                    *(undefined4 *)((long)pvVar9 + uVar18 * 4 + 4) = 0xff7fffff;
                  }
                  auVar53 = (auVar42 | auVar62) ^ auVar55;
                  iVar25 = auVar53._4_4_;
                  if (iVar25 <= iVar5 && (iVar25 != iVar5 || auVar53._0_4_ <= auVar30._0_4_)) {
                    *(undefined4 *)((long)pvVar9 + uVar18 * 4 + 8) = 0xff7fffff;
                    *(undefined4 *)((long)pvVar9 + uVar18 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar18 = uVar18 + 4;
                } while ((uVar16 + 3 & 0xfffffffc) != uVar18);
              }
              if (0 < (int)uVar6) {
                sVar20 = bottom_blob->elemsize;
                sVar28 = bottom_blob->cstep;
                pvVar9 = bottom_blob->data;
                pvVar10 = top_blob->data;
                uVar18 = 0;
                do {
                  if (0 < (int)uVar15) {
                    uVar22 = 0;
                    do {
                      fVar48 = *(float *)((long)pvVar9 + uVar22 * 4);
                      fVar33 = *(float *)((long)pvVar10 + uVar22 * 4);
                      if (fVar48 <= fVar33) {
                        fVar48 = fVar33;
                      }
                      *(float *)((long)pvVar10 + uVar22 * 4) = fVar48;
                      uVar22 = uVar22 + 1;
                    } while (uVar15 != uVar22);
                  }
                  uVar18 = uVar18 + 1;
                  pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
                } while (uVar18 != uVar14);
              }
              if ((int)uVar15 < 1) {
                return 0;
              }
              pvVar9 = top_blob->data;
              uVar18 = 0;
              do {
                *(float *)((long)pvVar9 + uVar18 * 4) =
                     *(float *)((long)pvVar9 + uVar18 * 4) * fVar34;
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
              return 0;
            case -1:
              uVar22 = sVar28 + 3 & 0x3ffffffffffffffc;
              lVar8 = sVar20 * uVar22;
              if (lVar8 == 0) {
                return -100;
              }
              pvVar9 = malloc(lVar8 * 4 + 0x1c);
              uVar11 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
              *(void **)(uVar11 - 8) = pvVar9;
              *(undefined4 *)(uVar11 + lVar8 * 4) = 1;
              auVar55 = _DAT_00134720;
              uVar15 = uVar6 * (int)uVar22;
              if (0 < (int)uVar15) {
                uVar12 = 0;
                do {
                  *(undefined1 (*) [16])(uVar11 + uVar12 * 4) = auVar55;
                  uVar12 = uVar12 + 4;
                } while (uVar15 != uVar12);
              }
              if (0 < (int)uVar6) {
                sVar20 = bottom_blob->elemsize;
                sVar3 = bottom_blob->cstep;
                pvVar9 = bottom_blob->data;
                uVar19 = 0;
                uVar12 = uVar11;
                do {
                  if (0 < (int)uVar17) {
                    pvVar10 = (void *)(sVar20 * sVar3 * uVar19 + (long)pvVar9);
                    uVar24 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        uVar27 = 0;
                        do {
                          fVar48 = *(float *)((long)pvVar10 + uVar24 * 4);
                          fVar33 = *(float *)(uVar12 + uVar27 * 4);
                          if (fVar48 <= fVar33) {
                            fVar48 = fVar33;
                          }
                          *(float *)(uVar12 + uVar27 * 4) = fVar48;
                          uVar27 = uVar27 + 1;
                        } while (uVar18 != uVar27);
                      }
                      pvVar10 = (void *)((long)pvVar10 + sVar28 * 4);
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != uVar17);
                  }
                  uVar19 = uVar19 + 1;
                  uVar12 = uVar12 + uVar22 * 4;
                } while (uVar19 != uVar14);
              }
              auVar51 = _DAT_00134480;
              auVar62 = _DAT_00134470;
              auVar55 = _DAT_00134400;
              uVar17 = (int)sVar7 * top_blob->c;
              if (0 < (int)uVar17) {
                pvVar9 = top_blob->data;
                lVar13 = (ulong)uVar17 - 1;
                auVar32._8_4_ = (int)lVar13;
                auVar32._0_8_ = lVar13;
                auVar32._12_4_ = (int)((ulong)lVar13 >> 0x20);
                uVar12 = 0;
                auVar32 = auVar32 ^ _DAT_00134400;
                do {
                  auVar46._8_4_ = (int)uVar12;
                  auVar46._0_8_ = uVar12;
                  auVar46._12_4_ = (int)(uVar12 >> 0x20);
                  auVar53 = (auVar46 | auVar51) ^ auVar55;
                  iVar5 = auVar32._4_4_;
                  if ((bool)(~(auVar53._4_4_ == iVar5 && auVar32._0_4_ < auVar53._0_4_ ||
                              iVar5 < auVar53._4_4_) & 1)) {
                    *(undefined4 *)((long)pvVar9 + uVar12 * 4) = 0xff7fffff;
                  }
                  if ((auVar53._12_4_ != auVar32._12_4_ || auVar53._8_4_ <= auVar32._8_4_) &&
                      auVar53._12_4_ <= auVar32._12_4_) {
                    *(undefined4 *)((long)pvVar9 + uVar12 * 4 + 4) = 0xff7fffff;
                  }
                  auVar53 = (auVar46 | auVar62) ^ auVar55;
                  iVar25 = auVar53._4_4_;
                  if (iVar25 <= iVar5 && (iVar25 != iVar5 || auVar53._0_4_ <= auVar32._0_4_)) {
                    *(undefined4 *)((long)pvVar9 + uVar12 * 4 + 8) = 0xff7fffff;
                    *(undefined4 *)((long)pvVar9 + uVar12 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar12 = uVar12 + 4;
                } while ((uVar17 + 3 & 0xfffffffc) != uVar12);
              }
              if (0 < (int)uVar6) {
                pvVar9 = top_blob->data;
                uVar19 = 0;
                uVar12 = uVar11;
                do {
                  if (0 < (int)uVar16) {
                    uVar24 = 0;
                    do {
                      fVar48 = *(float *)(uVar12 + uVar24 * 4);
                      fVar33 = *(float *)((long)pvVar9 + uVar24 * 4);
                      if (fVar48 <= fVar33) {
                        fVar48 = fVar33;
                      }
                      *(float *)((long)pvVar9 + uVar24 * 4) = fVar48;
                      uVar24 = uVar24 + 1;
                    } while (uVar18 != uVar24);
                  }
                  uVar19 = uVar19 + 1;
                  uVar12 = uVar12 + uVar22 * 4;
                } while (uVar19 != uVar14);
              }
              lVar8 = lVar8 * 4;
              if (0 < (int)uVar16) {
                pvVar9 = top_blob->data;
                uVar14 = 0;
                do {
                  *(float *)((long)pvVar9 + uVar14 * 4) =
                       *(float *)((long)pvVar9 + uVar14 * 4) * fVar34;
                  uVar14 = uVar14 + 1;
                } while (uVar18 != uVar14);
              }
            }
            goto LAB_00116f3d;
          }
          if (uVar6 == 0) {
            return -100;
          }
        }
        lVar8 = sVar20 << 2;
        pvVar9 = malloc(sVar20 * 4 + 0x1c);
        uVar11 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
        *(void **)(uVar11 - 8) = pvVar9;
        *(undefined4 *)(uVar11 + sVar20 * 4) = 1;
        if ((int)uVar6 < 1) {
          fVar33 = -3.4028235e+38;
        }
        else {
          sVar20 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar9 = bottom_blob->data;
          uVar18 = 0;
          do {
            fVar33 = -3.4028235e+38;
            if (0 < (int)uVar15) {
              uVar22 = 0;
              fVar33 = -3.4028235e+38;
              do {
                fVar48 = *(float *)((long)pvVar9 + uVar22 * 4);
                if (fVar33 <= fVar48) {
                  fVar33 = fVar48;
                }
                uVar22 = uVar22 + 1;
              } while (uVar15 != uVar22);
            }
            *(float *)(uVar11 + uVar18 * 4) = fVar33;
            uVar18 = uVar18 + 1;
            pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
          } while (uVar18 != uVar14);
          fVar33 = -3.4028235e+38;
          uVar18 = 0;
          do {
            fVar48 = *(float *)(uVar11 + uVar18 * 4);
            if (fVar33 <= fVar48) {
              fVar33 = fVar48;
            }
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        goto LAB_0011658f;
      }
      iVar5 = this->dim;
      fVar34 = this->coeff;
      uVar16 = bottom_blob->w;
      uVar18 = (ulong)uVar16;
      uVar17 = bottom_blob->h;
      sVar28 = (size_t)(int)uVar16;
      uVar6 = bottom_blob->c;
      uVar14 = (ulong)uVar6;
      sVar20 = (size_t)(int)uVar6;
      uVar15 = uVar17 * uVar16;
      if (iVar5 == 0) {
        if (((top_blob->dims == 1) && (top_blob->w == 1)) && (top_blob->elemsize == 4))
        goto switchD_00114b46_caseD_0;
        piVar1 = top_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->elemsize = 4;
        top_blob->dims = 1;
        top_blob->w = 1;
        top_blob->h = 1;
        top_blob->c = 1;
        top_blob->cstep = 1;
        pvVar9 = malloc(0x20);
        pvVar10 = (void *)((long)pvVar9 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar10 - 8) = pvVar9;
        top_blob->data = pvVar10;
        top_blob->refcount = (int *)((long)pvVar10 + 4);
        *(undefined4 *)((long)pvVar10 + 4) = 1;
        if (uVar6 == 0 || top_blob->c == 0) {
          return -100;
        }
LAB_00115c9f:
        lVar8 = sVar20 << 2;
        pvVar9 = malloc(sVar20 * 4 + 0x1c);
        uVar11 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
        *(void **)(uVar11 - 8) = pvVar9;
        *(undefined4 *)(uVar11 + sVar20 * 4) = 1;
        if ((int)uVar6 < 1) {
          fVar33 = 3.4028235e+38;
        }
        else {
          sVar20 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar9 = bottom_blob->data;
          uVar18 = 0;
          do {
            fVar33 = 3.4028235e+38;
            if (0 < (int)uVar15) {
              uVar22 = 0;
              fVar33 = 3.4028235e+38;
              do {
                fVar48 = *(float *)((long)pvVar9 + uVar22 * 4);
                if (fVar48 <= fVar33) {
                  fVar33 = fVar48;
                }
                uVar22 = uVar22 + 1;
              } while (uVar15 != uVar22);
            }
            *(float *)(uVar11 + uVar18 * 4) = fVar33;
            uVar18 = uVar18 + 1;
            pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
          } while (uVar18 != uVar14);
          fVar33 = 3.4028235e+38;
          uVar18 = 0;
          do {
            fVar48 = *(float *)(uVar11 + uVar18 * 4);
            if (fVar48 <= fVar33) {
              fVar33 = fVar48;
            }
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        goto LAB_0011658f;
      }
      switch(iVar5) {
      case 1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar6)) || (top_blob->elemsize != 4)) {
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar6;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar20;
          if (uVar6 != 0) {
            pvVar10 = malloc(sVar20 * 4 + 0x1c);
            pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar9 - 8) = pvVar10;
            top_blob->data = pvVar9;
            piVar1 = (int *)((long)pvVar9 + sVar20 * 4);
            top_blob->refcount = piVar1;
            *piVar1 = 1;
            sVar7 = sVar20;
            goto LAB_00115ad4;
          }
        }
        break;
      case 2:
        if (((top_blob->dims != 2) || (top_blob->w != uVar17)) ||
           ((top_blob->h != uVar6 || (top_blob->elemsize != 4)))) {
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 2;
          top_blob->w = uVar17;
          top_blob->h = uVar6;
          top_blob->c = 1;
          uVar60 = uVar6 * uVar17;
          goto LAB_00115a55;
        }
        break;
      case -2:
        if ((((top_blob->dims == 2) && (top_blob->w == uVar16)) && (top_blob->h == uVar17)) &&
           (top_blob->elemsize == 4)) break;
        piVar1 = top_blob->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->elemsize = 4;
        top_blob->dims = 2;
        top_blob->w = uVar16;
        top_blob->h = uVar17;
        top_blob->c = 1;
        uVar60 = uVar15;
LAB_00115a55:
        sVar7 = (size_t)(int)uVar60;
        top_blob->cstep = sVar7;
        if (uVar60 == 0) break;
        pvVar10 = malloc(sVar7 * 4 + 0x1c);
        pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar9 - 8) = pvVar10;
        top_blob->data = pvVar9;
        piVar1 = (int *)((long)pvVar9 + sVar7 * 4);
        top_blob->refcount = piVar1;
        *piVar1 = 1;
        goto LAB_00115ad4;
      case -1:
        if (((top_blob->dims != 1) || (top_blob->w != uVar16)) || (top_blob->elemsize != 4)) {
          piVar1 = top_blob->refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if ((*piVar1 == 0) && (top_blob->data != (void *)0x0)) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->elemsize = 4;
          top_blob->dims = 1;
          top_blob->w = uVar16;
          top_blob->h = 1;
          top_blob->c = 1;
          top_blob->cstep = sVar28;
          if (uVar16 != 0) {
            pvVar10 = malloc(sVar28 * 4 + 0x1c);
            pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar9 - 8) = pvVar10;
            top_blob->data = pvVar9;
            piVar1 = (int *)((long)pvVar9 + sVar28 * 4);
            top_blob->refcount = piVar1;
            *piVar1 = 1;
            sVar7 = sVar28;
            goto LAB_00115ad4;
          }
        }
      }
switchD_00114b46_caseD_0:
      pvVar9 = top_blob->data;
      if (pvVar9 == (void *)0x0) {
        return -100;
      }
      sVar7 = top_blob->cstep;
LAB_00115ad4:
      auVar53 = _DAT_00134710;
      auVar51 = _DAT_00134480;
      auVar62 = _DAT_00134470;
      auVar55 = _DAT_00134400;
      if (sVar7 * (long)top_blob->c == 0) {
        return -100;
      }
      if (iVar5 == 0) {
        if (uVar6 == 0) {
          return -100;
        }
        goto LAB_00115c9f;
      }
      switch(iVar5) {
      default:
        return 0;
      case 1:
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar9 = bottom_blob->data;
        sVar20 = bottom_blob->elemsize;
        sVar28 = bottom_blob->cstep;
        pvVar10 = top_blob->data;
        uVar18 = 0;
        do {
          fVar33 = 3.4028235e+38;
          if (0 < (int)uVar15) {
            uVar22 = 0;
            fVar33 = 3.4028235e+38;
            do {
              fVar48 = *(float *)((long)pvVar9 + uVar22 * 4);
              if (fVar48 <= fVar33) {
                fVar33 = fVar48;
              }
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          *(float *)((long)pvVar10 + uVar18 * 4) = fVar33 * fVar34;
          uVar18 = uVar18 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
        } while (uVar18 != uVar14);
        return 0;
      case 2:
        if ((int)uVar6 < 1) {
          return 0;
        }
        pvVar9 = bottom_blob->data;
        sVar20 = bottom_blob->elemsize;
        sVar3 = bottom_blob->cstep;
        sVar4 = top_blob->elemsize;
        pvVar10 = top_blob->data;
        uVar6 = uVar16 - 1;
        uVar18 = 0;
        do {
          if (0 < (int)uVar17) {
            pvVar23 = (void *)(sVar20 * sVar3 * uVar18 + (long)pvVar9);
            uVar22 = 0;
            do {
              fVar33 = 3.4028235e+38;
              if (0 < (int)uVar16) {
                uVar2 = *(undefined4 *)((long)pvVar23 + uVar22 * 4);
                auVar51._4_4_ = uVar2;
                auVar51._0_4_ = uVar2;
                auVar55 = auVar53;
                iVar5 = 4;
                do {
                  auVar62 = auVar55;
                  auVar51._8_4_ = uVar2;
                  auVar51._12_4_ = uVar2;
                  auVar55 = minps(auVar51,auVar62);
                  iVar26 = iVar5 + -4;
                  iVar25 = (uVar16 + 3 & 0xfffffffc) + iVar5;
                  iVar5 = iVar26;
                } while (iVar25 != 8);
                uVar15 = -iVar26;
                uVar60 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)(uVar15 ^ 0x80000000));
                uVar64 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 1) ^ 0x80000000));
                uVar65 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 2) ^ 0x80000000));
                uVar15 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar15 | 3) ^ 0x80000000));
                auVar45._0_4_ = auVar62._0_4_ & uVar60;
                auVar45._4_4_ = auVar62._4_4_ & uVar64;
                auVar45._8_4_ = auVar62._8_4_ & uVar65;
                auVar45._12_4_ = auVar62._12_4_ & uVar15;
                auVar61._0_4_ = ~uVar60 & auVar55._0_4_;
                auVar61._4_4_ = ~uVar64 & auVar55._4_4_;
                auVar61._8_4_ = ~uVar65 & auVar55._8_4_;
                auVar61._12_4_ = ~uVar15 & auVar55._12_4_;
                auVar61 = auVar61 | auVar45;
                auVar52._0_8_ = auVar61._8_8_;
                auVar52._8_4_ = auVar61._8_4_;
                auVar52._12_4_ = auVar61._12_4_;
                auVar55 = minps(auVar52,auVar61);
                fVar33 = auVar55._4_4_;
                if (auVar55._0_4_ <= auVar55._4_4_) {
                  fVar33 = auVar55._0_4_;
                }
              }
              *(float *)((long)pvVar10 + uVar22 * 4 + sVar7 * sVar4 * uVar18) = fVar33 * fVar34;
              pvVar23 = (void *)((long)pvVar23 + sVar28 * 4);
              uVar22 = uVar22 + 1;
            } while (uVar22 != uVar17);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar14);
        return 0;
      case -2:
        uVar16 = (int)sVar7 * top_blob->c;
        if (0 < (int)uVar16) {
          lVar8 = (ulong)uVar16 - 1;
          auVar29._8_4_ = (int)lVar8;
          auVar29._0_8_ = lVar8;
          auVar29._12_4_ = (int)((ulong)lVar8 >> 0x20);
          uVar18 = 0;
          auVar29 = auVar29 ^ _DAT_00134400;
          do {
            auVar40._8_4_ = (int)uVar18;
            auVar40._0_8_ = uVar18;
            auVar40._12_4_ = (int)(uVar18 >> 0x20);
            auVar53 = (auVar40 | auVar51) ^ auVar55;
            iVar5 = auVar29._4_4_;
            if ((bool)(~(auVar53._4_4_ == iVar5 && auVar29._0_4_ < auVar53._0_4_ ||
                        iVar5 < auVar53._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar9 + uVar18 * 4) = 0x7f7fffff;
            }
            if ((auVar53._12_4_ != auVar29._12_4_ || auVar53._8_4_ <= auVar29._8_4_) &&
                auVar53._12_4_ <= auVar29._12_4_) {
              *(undefined4 *)((long)pvVar9 + uVar18 * 4 + 4) = 0x7f7fffff;
            }
            auVar53 = (auVar40 | auVar62) ^ auVar55;
            iVar25 = auVar53._4_4_;
            if (iVar25 <= iVar5 && (iVar25 != iVar5 || auVar53._0_4_ <= auVar29._0_4_)) {
              *(undefined4 *)((long)pvVar9 + uVar18 * 4 + 8) = 0x7f7fffff;
              *(undefined4 *)((long)pvVar9 + uVar18 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar18 = uVar18 + 4;
          } while ((uVar16 + 3 & 0xfffffffc) != uVar18);
        }
        if (0 < (int)uVar6) {
          sVar20 = bottom_blob->elemsize;
          sVar28 = bottom_blob->cstep;
          pvVar9 = bottom_blob->data;
          pvVar10 = top_blob->data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar15) {
              uVar22 = 0;
              do {
                fVar48 = *(float *)((long)pvVar9 + uVar22 * 4);
                fVar33 = *(float *)((long)pvVar10 + uVar22 * 4);
                if (fVar33 <= fVar48) {
                  fVar48 = fVar33;
                }
                *(float *)((long)pvVar10 + uVar22 * 4) = fVar48;
                uVar22 = uVar22 + 1;
              } while (uVar15 != uVar22);
            }
            uVar18 = uVar18 + 1;
            pvVar9 = (void *)((long)pvVar9 + sVar20 * sVar28);
          } while (uVar18 != uVar14);
        }
        if ((int)uVar15 < 1) {
          return 0;
        }
        pvVar9 = top_blob->data;
        uVar18 = 0;
        do {
          *(float *)((long)pvVar9 + uVar18 * 4) = *(float *)((long)pvVar9 + uVar18 * 4) * fVar34;
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
        return 0;
      case -1:
        uVar22 = sVar28 + 3 & 0x3ffffffffffffffc;
        lVar8 = sVar20 * uVar22;
        if (lVar8 == 0) {
          return -100;
        }
        pvVar9 = malloc(lVar8 * 4 + 0x1c);
        uVar11 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
        *(void **)(uVar11 - 8) = pvVar9;
        *(undefined4 *)(uVar11 + lVar8 * 4) = 1;
        auVar55 = _DAT_00134710;
        uVar15 = uVar6 * (int)uVar22;
        if (0 < (int)uVar15) {
          uVar12 = 0;
          do {
            *(undefined1 (*) [16])(uVar11 + uVar12 * 4) = auVar55;
            uVar12 = uVar12 + 4;
          } while (uVar15 != uVar12);
        }
        if (0 < (int)uVar6) {
          sVar20 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pvVar9 = bottom_blob->data;
          uVar19 = 0;
          uVar12 = uVar11;
          do {
            if (0 < (int)uVar17) {
              pvVar10 = (void *)(sVar20 * sVar3 * uVar19 + (long)pvVar9);
              uVar24 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar27 = 0;
                  do {
                    fVar48 = *(float *)((long)pvVar10 + uVar24 * 4);
                    fVar33 = *(float *)(uVar12 + uVar27 * 4);
                    if (fVar33 <= fVar48) {
                      fVar48 = fVar33;
                    }
                    *(float *)(uVar12 + uVar27 * 4) = fVar48;
                    uVar27 = uVar27 + 1;
                  } while (uVar18 != uVar27);
                }
                pvVar10 = (void *)((long)pvVar10 + sVar28 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar24 != uVar17);
            }
            uVar19 = uVar19 + 1;
            uVar12 = uVar12 + uVar22 * 4;
          } while (uVar19 != uVar14);
        }
        auVar51 = _DAT_00134480;
        auVar62 = _DAT_00134470;
        auVar55 = _DAT_00134400;
        uVar17 = (int)sVar7 * top_blob->c;
        if (0 < (int)uVar17) {
          pvVar9 = top_blob->data;
          lVar13 = (ulong)uVar17 - 1;
          auVar31._8_4_ = (int)lVar13;
          auVar31._0_8_ = lVar13;
          auVar31._12_4_ = (int)((ulong)lVar13 >> 0x20);
          uVar12 = 0;
          auVar31 = auVar31 ^ _DAT_00134400;
          do {
            auVar43._8_4_ = (int)uVar12;
            auVar43._0_8_ = uVar12;
            auVar43._12_4_ = (int)(uVar12 >> 0x20);
            auVar53 = (auVar43 | auVar51) ^ auVar55;
            iVar5 = auVar31._4_4_;
            if ((bool)(~(auVar53._4_4_ == iVar5 && auVar31._0_4_ < auVar53._0_4_ ||
                        iVar5 < auVar53._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar9 + uVar12 * 4) = 0x7f7fffff;
            }
            if ((auVar53._12_4_ != auVar31._12_4_ || auVar53._8_4_ <= auVar31._8_4_) &&
                auVar53._12_4_ <= auVar31._12_4_) {
              *(undefined4 *)((long)pvVar9 + uVar12 * 4 + 4) = 0x7f7fffff;
            }
            auVar53 = (auVar43 | auVar62) ^ auVar55;
            iVar25 = auVar53._4_4_;
            if (iVar25 <= iVar5 && (iVar25 != iVar5 || auVar53._0_4_ <= auVar31._0_4_)) {
              *(undefined4 *)((long)pvVar9 + uVar12 * 4 + 8) = 0x7f7fffff;
              *(undefined4 *)((long)pvVar9 + uVar12 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar12 = uVar12 + 4;
          } while ((uVar17 + 3 & 0xfffffffc) != uVar12);
        }
        if (0 < (int)uVar6) {
          pvVar9 = top_blob->data;
          uVar19 = 0;
          uVar12 = uVar11;
          do {
            if (0 < (int)uVar16) {
              uVar24 = 0;
              do {
                fVar48 = *(float *)(uVar12 + uVar24 * 4);
                fVar33 = *(float *)((long)pvVar9 + uVar24 * 4);
                if (fVar33 <= fVar48) {
                  fVar48 = fVar33;
                }
                *(float *)((long)pvVar9 + uVar24 * 4) = fVar48;
                uVar24 = uVar24 + 1;
              } while (uVar18 != uVar24);
            }
            uVar19 = uVar19 + 1;
            uVar12 = uVar12 + uVar22 * 4;
          } while (uVar19 != uVar14);
        }
        lVar8 = lVar8 * 4;
        if (0 < (int)uVar16) {
          pvVar9 = top_blob->data;
          uVar14 = 0;
          do {
            *(float *)((long)pvVar9 + uVar14 * 4) = *(float *)((long)pvVar9 + uVar14 * 4) * fVar34;
            uVar14 = uVar14 + 1;
          } while (uVar18 != uVar14);
        }
      }
LAB_00116f3d:
      LOCK();
      piVar1 = (int *)(uVar11 + lVar8);
      iVar5 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    if (uVar11 == 0) {
      return 0;
    }
    if (iVar5 != 1) {
      return 0;
    }
    pvVar9 = *(void **)(uVar11 - 8);
    goto LAB_001165b3;
  }
  if (iVar5 != 1) {
    return 0;
  }
  pvVar9 = *(void **)((long)pvVar10 - 8);
LAB_001165b3:
  free(pvVar9);
switchD_0011632e_caseD_0:
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    if (operation == ReductionOp_SUM)
        return reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_ASUM)
        return reduction_op< reduction_op_asum<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_SUMSQ)
        return reduction_op< reduction_op_sumsq<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_MEAN)
    {
        int ret = reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);
        if (ret != 0)
            return -100;

        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        if (dim == 0)
        {
            top_blob[0] /= channels * size;
        }
        else if (dim == 1)
        {
            for (int q=0; q<channels; q++)
            {
                top_blob[q] /= size;
            }
        }
        else if (dim == 2)
        {
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<h; i++)
                {
                    outptr[i] /= w;
                }
            }
        }
        else if (dim == -1)
        {
            for (int j=0; j<w; j++)
            {
                top_blob[j] /= h * channels;
            }
        }
        else if (dim == -2)
        {
            for (int i=0; i<size; i++)
            {
                top_blob[i] /= channels;
            }
        }
    }

    if (operation == ReductionOp_MAX)
        return reduction_op< reduction_op_max<float>, reduction_op_max<float> >(bottom_blob, top_blob, -FLT_MAX, dim, coeff);

    if (operation == ReductionOp_MIN)
        return reduction_op< reduction_op_min<float>, reduction_op_min<float> >(bottom_blob, top_blob, FLT_MAX, dim, coeff);

    if (operation == ReductionOp_PROD)
        return reduction_op< std::multiplies<float>, std::multiplies<float> >(bottom_blob, top_blob, 1.f, dim, coeff);

    return 0;
}